

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

longlong * __thiscall PrimitiveTestClass::FillValues<long_long*>(PrimitiveTestClass *this)

{
  longlong *plVar1;
  size_t i;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)this->SIZE;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = lVar3 * 8;
  }
  plVar1 = (longlong *)operator_new__(uVar4);
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    plVar1[lVar2] = 0xff;
  }
  return plVar1;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }